

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O2

void gatom_bang(t_gatom *x)

{
  int *piVar1;
  _outlet *p_Var2;
  t_pd *pp_Var3;
  uint argc;
  t_atom *ptVar4;
  ulong uVar5;
  t_symbol *ptVar6;
  ulong uVar7;
  char *pcVar8;
  
  ptVar4 = gatom_getatom(x);
  if (x->a_flavor == 2) {
    p_Var2 = (x->a_text).te_outlet;
    if (p_Var2 != (_outlet *)0x0) {
      outlet_symbol(p_Var2,(ptVar4->a_w).w_symbol);
    }
    pcVar8 = x->a_symto->s_name;
    if ((*pcVar8 == '\0') || (pp_Var3 = x->a_expanded_to->s_thing, pp_Var3 == (t_pd *)0x0)) {
      return;
    }
    if (x->a_symto != x->a_symfrom) {
      pd_symbol(pp_Var3,(ptVar4->a_w).w_symbol);
      return;
    }
  }
  else {
    if (x->a_flavor == 1) {
      p_Var2 = (x->a_text).te_outlet;
      if (p_Var2 != (_outlet *)0x0) {
        outlet_float(p_Var2,(ptVar4->a_w).w_float);
      }
      if (*x->a_expanded_to->s_name == '\0') {
        return;
      }
      pp_Var3 = x->a_expanded_to->s_thing;
      if (pp_Var3 == (t_pd *)0x0) {
        return;
      }
      ptVar6 = x->a_symto;
      if (ptVar6 != x->a_symfrom) {
        pd_float(pp_Var3,(ptVar4->a_w).w_float);
        return;
      }
    }
    else {
      argc = binbuf_getnatom((x->a_text).te_binbuf);
      ptVar4 = binbuf_getvec((x->a_text).te_binbuf);
      uVar5 = (ulong)argc;
      if ((int)argc < 1) {
        uVar5 = 0;
      }
      uVar7 = 0;
      while (uVar5 * 0x10 + 0x10 != uVar7 + 0x10) {
        piVar1 = (int *)((long)&ptVar4->a_type + uVar7);
        uVar7 = uVar7 + 0x10;
        if (1 < *piVar1 - 1U) {
          pd_error(x,"list: only sends literal numbers and symbols");
          return;
        }
      }
      p_Var2 = (x->a_text).te_outlet;
      if (p_Var2 != (_outlet *)0x0) {
        outlet_list(p_Var2,&s_list,argc,ptVar4);
      }
      if (*x->a_expanded_to->s_name == '\0') {
        return;
      }
      pp_Var3 = x->a_expanded_to->s_thing;
      if (pp_Var3 == (t_pd *)0x0) {
        return;
      }
      ptVar6 = x->a_symto;
      if (ptVar6 != x->a_symfrom) {
        pd_list(pp_Var3,&s_list,argc,ptVar4);
        return;
      }
    }
    pcVar8 = ptVar6->s_name;
  }
  pd_error(x,"%s: atom with same send/receive name (infinite loop)",pcVar8);
  return;
}

Assistant:

static void gatom_bang(t_gatom *x)
{
    t_atom *ap = gatom_getatom(x);
    if (x->a_flavor == A_FLOAT)
    {
        if (x->a_text.te_outlet)
            outlet_float(x->a_text.te_outlet, ap->a_w.w_float);
        if (*x->a_expanded_to->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_float(x->a_expanded_to->s_thing, ap->a_w.w_float);
        }
    }
    else if (x->a_flavor == A_SYMBOL)
    {
        if (x->a_text.te_outlet)
            outlet_symbol(x->a_text.te_outlet, ap->a_w.w_symbol);
        if (*x->a_symto->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_symbol(x->a_expanded_to->s_thing, ap->a_w.w_symbol);
        }
    }
    else    /* list */
    {
        int argc = binbuf_getnatom(x->a_text.te_binbuf), i;
        t_atom *argv = binbuf_getvec(x->a_text.te_binbuf);
        for (i = 0; i < argc; i++)
            if (argv[i].a_type != A_FLOAT && argv[i].a_type != A_SYMBOL)
        {
            pd_error(x, "list: only sends literal numbers and symbols");
            return;
        }
        if (x->a_text.te_outlet)
            outlet_list(x->a_text.te_outlet, &s_list, argc, argv);
        if (*x->a_expanded_to->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_list(x->a_expanded_to->s_thing, &s_list, argc, argv);
        }
    }
}